

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

string * __thiscall
iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *actual,char *matcher_str,
          AssertionResult *ar)

{
  ostream *poVar1;
  iu_global_format_stringstream strm;
  undefined1 auStack_1a8 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_1a8);
  poVar1 = std::operator<<((ostream *)(auStack_1a8 + 0x10),"error: Expected: ");
  poVar1 = std::operator<<(poVar1,actual);
  poVar1 = std::operator<<(poVar1,"\n  Actual: ");
  poVar1 = std::operator<<(poVar1,(char *)this);
  poVar1 = std::operator<<(poVar1,"\nWhich is: ");
  std::operator<<(poVar1,*(char **)matcher_str);
  std::__cxx11::stringbuf::str();
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)auStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string MatcherAssertionFailureMessage(const char* actual, const char* matcher_str
                                                    , const AssertionResult& ar)
{
    iu_global_format_stringstream strm;
    strm << "error: Expected: " << matcher_str
        << "\n  Actual: " << actual
        << "\nWhich is: " << ar.message();
    return strm.str();
}